

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O1

type * __thiscall
nonsugar::
parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>
          (type *__return_storage_ptr__,nonsugar *this,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          begin,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                end,
          basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *command,argument_order order)

{
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>
  *flg;
  size_type *flg_00;
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__n;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  undefined8 uVar3;
  undefined8 *puVar4;
  int iVar5;
  pointer psVar6;
  ostream *poVar7;
  basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pbVar8;
  pointer pbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *long_name;
  undefined1 auVar10 [8];
  bool bVar11;
  bool exact;
  bool exclusive;
  const_iterator arg_it;
  string_type name;
  const_iterator arg_last;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  match;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  partial_matches;
  iterator argument_it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argument_args;
  iterator argument_last;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  sstream<string_type> ss;
  undefined1 local_2a2 [10];
  undefined1 local_298 [8];
  undefined1 local_290 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  value_type *local_270;
  undefined1 local_268 [32];
  undefined1 local_248 [8];
  undefined8 *puStack_240;
  undefined8 local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  int local_20c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  value_type **local_198;
  element_type *local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  undefined1 *local_180;
  
  local_20c = (int)command;
  (__return_storage_ptr__->
  super_option_pair<char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).value.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->
  super_option_pair<char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).value.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->super_option_pair<char,__o_,_int>).value.
  super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->super_option_pair<char,__o_,_int>).value.
  super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->super_option_pair<char,__h_,_void>).value.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->super_option_pair<char,__h_,_void>).value.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->super_option_pair<char,__h_,_void>).value.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)((long)&end._M_current[10].field_2 + 8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__return_storage_ptr__->super_option_pair<char,__h_,_void>).value.
              super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(end._M_current + 0xb));
  (__return_storage_ptr__->super_option_pair<char,__o_,_int>).value.
  super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)end._M_current[5].field_2._M_allocated_capacity;
  local_2a2._2_8_ = __return_storage_ptr__;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__return_storage_ptr__->super_option_pair<char,__o_,_int>).value.
              super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&end._M_current[5].field_2 + 8));
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1d0,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )this,begin,(allocator_type *)local_1b8);
  local_298 = (undefined1  [8])
              local_1d0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_270 = local_1d0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_2a2[1] = '\0';
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_1d0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1d0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    flg = (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>
           *)(end._M_current + 2);
    flg_00 = &end._M_current[7]._M_string_length;
    pbVar9 = local_1d0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      local_1b8._0_8_ = local_1b8 + 0x10;
      local_298 = (undefined1  [8])pbVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"--","");
      __n = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            pbVar9->_M_string_length;
      if (__n == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1b8._8_8_) {
        if (__n == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar11 = true;
        }
        else {
          iVar5 = bcmp((pbVar9->_M_dataplus)._M_p,(void *)local_1b8._0_8_,(size_t)__n);
          bVar11 = iVar5 == 0;
        }
      }
      else {
        bVar11 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
      }
      auVar10 = local_298;
      if (bVar11) break;
      local_268._16_8_ = (pointer)0x0;
      local_268._24_8_ = (char *)0x0;
      local_268._0_8_ = (pointer)0x0;
      local_268._8_8_ = (pointer)0x0;
      local_290._0_8_ = &local_280;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"--([^=]+)(?:=(.*))?","");
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,0x10
                );
      _Var2._M_current = *(char **)auVar10;
      bVar11 = std::__detail::
               __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                         (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(_Var2._M_current + *(size_type *)((long)auVar10 + 8)),
                          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_268,
                          (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1b8,0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._0_8_ != &local_280) {
        operator_delete((void *)local_290._0_8_,local_280._M_allocated_capacity + 1);
      }
      auVar10 = local_298;
      if (bVar11) {
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str((string_type *)local_290,
              (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)local_268,1);
        uVar3 = local_2a2._2_8_;
        local_2a2[0] = '\0';
        local_248 = (undefined1  [8])0x0;
        puStack_240 = (undefined8 *)0x0;
        local_238._0_1_ = false;
        local_238._1_7_ = 0;
        local_1b8._8_8_ = local_2a2;
        local_1a8._8_8_ = local_268 + 0x20;
        local_1b8._0_8_ = (string_type *)local_290;
        local_1a8._M_allocated_capacity = (size_type)end._M_current;
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#2}::operator()
                  ((_lambda_auto_1_const___2_ *)local_1b8,
                   (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>
                    *)flg_00);
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#2}::operator()((_lambda_auto_1_const___2_ *)local_1b8,flg);
        if (local_2a2[0] == '\0') {
          if (local_248 == (undefined1  [8])puStack_240) {
            pbVar8 = (basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)__cxa_allocate_exception(0x28);
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1f0,": unrecognized option: --","");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_230,end._M_current,&local_1f0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_230,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_290);
            basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::basic_error(pbVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1b8);
            __cxa_throw(pbVar8,&basic_error<std::__cxx11::string>::typeinfo,
                        basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~basic_error);
          }
          if (0x20 < (ulong)((long)puStack_240 - (long)local_248)) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            poVar1 = (ostream *)(local_1b8 + 0x10);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar1,((end._M_current)->_M_dataplus)._M_p,
                                (end._M_current)->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ambiguous option: --",0x16)
            ;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(char *)local_290._0_8_,local_290._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," [",2);
            puVar4 = puStack_240;
            if (local_248 != (undefined1  [8])puStack_240) {
              bVar11 = true;
              auVar10 = local_248;
              do {
                if (!bVar11) {
                  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar1,"--",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar1,*(char **)auVar10,*(undefined8 *)((long)auVar10 + 8));
                auVar10 = (undefined1  [8])((long)auVar10 + 0x20);
                bVar11 = false;
              } while (auVar10 != (undefined1  [8])puVar4);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
            pbVar8 = (basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::basic_error(pbVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_230);
            __cxa_throw(pbVar8,&basic_error<std::__cxx11::string>::typeinfo,
                        basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~basic_error);
          }
        }
        local_1b8._0_8_ = local_2a2;
        local_1b8._8_8_ = local_290;
        local_1a8._M_allocated_capacity = (size_type)local_268;
        local_1a8._8_8_ = local_298;
        local_198 = &local_270;
        local_190 = (element_type *)uVar3;
        local_180 = local_2a2 + 1;
        local_188 = end._M_current;
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#3}::operator()
                  ((_lambda_auto_1_const___3_ *)local_1b8,
                   (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>
                    *)flg_00);
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#3}::operator()((_lambda_auto_1_const___3_ *)local_1b8,flg);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_268 + 0x20));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._0_8_ != &local_280) {
          operator_delete((void *)local_290._0_8_,local_280._M_allocated_capacity + 1);
        }
LAB_0011b8c7:
        bVar11 = true;
      }
      else {
        local_290._0_8_ = &local_280;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"-(.+)","");
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
                   0x10);
        _Var2._M_current = *(char **)auVar10;
        bVar11 = std::__detail::
                 __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                           (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )(_Var2._M_current + *(size_type *)((long)auVar10 + 8)),
                            (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_268,
                            (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1b8,0);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._0_8_ != &local_280) {
          operator_delete((void *)local_290._0_8_,local_280._M_allocated_capacity + 1);
        }
        uVar3 = local_2a2._2_8_;
        if (bVar11) {
          if (local_268._0_8_ == local_268._8_8_) {
            bVar11 = false;
          }
          else {
            bVar11 = ((long)(local_268._8_8_ - local_268._0_8_) >> 3) * -0x5555555555555555 - 5U <
                     0xfffffffffffffffe;
          }
          psVar6 = (pointer)(local_268._8_8_ + -0x48);
          if (bVar11) {
            psVar6 = (pointer)(local_268._0_8_ + 0x18);
          }
          local_1f0._M_dataplus._M_p =
               (psVar6->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).first._M_current;
          while( true ) {
            if (local_268._0_8_ == local_268._8_8_) {
              bVar11 = false;
            }
            else {
              bVar11 = ((long)(local_268._8_8_ - local_268._0_8_) >> 3) * -0x5555555555555555 - 5U <
                       0xfffffffffffffffe;
            }
            if (bVar11) {
              psVar6 = (pointer)(local_268._0_8_ + 0x18);
            }
            else {
              psVar6 = (pointer)(local_268._8_8_ + -0x48);
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_1f0._M_dataplus._M_p ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (psVar6->
                super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).second._M_current) break;
            local_248[0] = *(undefined1 *)
                            &(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1f0._M_dataplus._M_p)->_M_dataplus)._M_p;
            local_2a2[0] = '\0';
            local_1b8._0_8_ = local_268 + 0x20;
            local_1b8._8_8_ = local_2a2;
            local_1a8._M_allocated_capacity = (size_type)end._M_current;
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#4}::operator()
                      ((_lambda_auto_1_const___4_ *)local_1b8,
                       (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>
                        *)flg_00);
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#4}::operator()((_lambda_auto_1_const___4_ *)local_1b8,flg);
            if (local_2a2[0] == '\0') {
              pbVar8 = (basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)__cxa_allocate_exception(0x28);
              local_230._M_allocated_capacity = (size_type)&local_220;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_230,": unrecognized option: -","");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_290,end._M_current,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_230);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1b8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_290,local_248[0]);
              basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::basic_error(pbVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1b8);
              __cxa_throw(pbVar8,&basic_error<std::__cxx11::string>::typeinfo,
                          basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~basic_error);
            }
            local_1b8._0_8_ = local_268 + 0x20;
            local_1b8._8_8_ = &local_1f0;
            local_1a8._M_allocated_capacity = (size_type)local_268;
            local_1a8._8_8_ = local_298;
            local_198 = &local_270;
            local_190 = (element_type *)uVar3;
            local_180 = local_2a2 + 1;
            local_188 = end._M_current;
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#5}::operator()
                      ((_lambda_auto_1_const___5_ *)local_1b8,
                       (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>
                        *)flg_00);
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#5}::operator()((_lambda_auto_1_const___5_ *)local_1b8,flg);
            local_1f0._M_dataplus._M_p = local_1f0._M_dataplus._M_p + 1;
          }
          goto LAB_0011b8c7;
        }
        if (local_20c == 1) {
          bVar11 = true;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_208,(value_type *)local_298);
        }
        else {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_208
                     ,local_208.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,local_298,local_270);
          bVar11 = false;
        }
      }
      if ((pointer)local_268._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_268._0_8_,local_268._16_8_ - local_268._0_8_);
      }
      if ((!bVar11) ||
         (pbVar9 = (pointer)((long)local_298 + 0x20), local_298 = (undefined1  [8])pbVar9,
         pbVar9 == local_270)) goto LAB_0011bb73;
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_208,
               local_208.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,(value_type *)((long)local_298 + 0x20),
               local_270);
  }
LAB_0011bb73:
  uVar3 = local_2a2._2_8_;
  if (local_2a2[1] == '\0') {
    local_1b8._0_8_ = &local_230;
    local_230._M_allocated_capacity =
         (size_type)
         local_208.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1b8._8_8_ = &local_1f0;
    local_1f0._M_dataplus._M_p =
         (pointer)local_208.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_1a8._M_allocated_capacity = local_2a2._2_8_;
    local_1a8._8_8_ = end._M_current;
    parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>const&,nonsugar::argument_order)
    ::{lambda(auto:1_const&)#8}::operator()
              ((_lambda_auto_1_const___8_ *)local_1b8,
               (argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&end._M_current[0xc].field_2 + 8));
    if ((pointer)local_230._M_allocated_capacity != local_1f0._M_dataplus._M_p) {
      pbVar8 = (basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__cxa_allocate_exception(0x28);
      local_290._0_8_ = &local_280;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_290,": unrecognized argument: ","");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                     end._M_current,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_230._M_allocated_capacity);
      basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::basic_error(pbVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b8);
      __cxa_throw(pbVar8,&basic_error<std::__cxx11::string>::typeinfo,
                  basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~basic_error);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d0);
  return (type *)(element_type *)uVar3;
}

Assistant:

inline typename detail::to_option_map<Command>::type parse(
    Iterator begin, Iterator end, Command const &command, argument_order order)
{
    using string_type = typename Command::string_type;
    using error_type = basic_error<string_type>;
    using regex_type = std::basic_regex<typename string_type::value_type>;
    auto const &_ = detail::widen<string_type>;

    typename detail::to_option_map<Command>::type opts;
    detail::tuple_for_each(command.m_flags, [&](auto const &flg)
        {
            constexpr auto option = detail::remove_cvr_t<decltype(flg)>::option();
            opts.template priv_value<option>() = flg.default_value;
        });

    std::vector<string_type> const args(begin, end);
    auto arg_it = args.begin();
    auto const arg_last = args.end();
    bool exclusive = false;

    constexpr auto subcommand_required =
        std::tuple_size<typename Command::subcommand_tuple_type>::value != 0;
    std::shared_ptr<string_type> subcommand_arg;
    std::vector<string_type> argument_args;

    for (; arg_it != arg_last; ++arg_it) {
        if (*arg_it == _("--")) {
            argument_args.insert(argument_args.end(), std::next(arg_it), arg_last);
            break;
        }
        std::match_results<typename string_type::const_iterator> match;
        if (std::regex_match(*arg_it, match, regex_type(_("--([^=]+)(?:=(.*))?")))) {
            // long flag
            auto const name = match.str(1);
            bool exact = false;
            std::vector<string_type> partial_matches;
            detail::tuple_for_each(command.m_flags, [&](auto const &flg)
                {
                    for (auto const &long_name : flg.long_names) {
                        if (name == long_name) {
                            if (std::exchange(exact, true)) {
                                throw error_type(
                                    command.m_header + _(": ambiguous option: --") + name);
                            }
                        } else if (detail::starts_with(long_name, name)) {
                            partial_matches.push_back(long_name);
                        }
                    }
                });
            if (!exact) {
                if (partial_matches.empty()) {
                    throw error_type(command.m_header + _(": unrecognized option: --") + name);
                } else if (partial_matches.size() >= 2) {
                    detail::sstream<string_type> ss;
                    ss << command.m_header << ": ambiguous option: --" << name << " [";
                    bool first = true;
                    for (auto const &long_name : partial_matches) {
                        if (!std::exchange(first, false)) ss << ", ";
                        ss << "--" << long_name;
                    }
                    ss << "]";
                    throw error_type(ss.str());
                }
            }
            detail::tuple_for_each(command.m_flags, [&](auto const &flg)
                {
                    using flag_type = detail::remove_cvr_t<decltype(flg)>;
                    using value_type = typename flag_type::value_type;
                    constexpr auto option = flag_type::option();
                    for (auto const &long_name : flg.long_names) {
                        if (exact ? name == long_name : detail::starts_with(long_name, name)) {
                            string_type err;
                            detail::parse_flag_long<string_type, value_type>()(
                                match, arg_it, arg_last,
                                opts.template priv_value<option>(), flg, err);
                            if (!err.empty()) {
                                throw error_type(command.m_header + _(": ") + err);
                            }
                            if (flg.exclusive) exclusive = true;
                        }
                    }
                });
        } else if (std::regex_match(*arg_it, match, regex_type(_("-(.+)")))) {
            // short flag
            for (auto it = match[1].first; it != match[1].second; ++it) {
                auto const name = *it;
                bool exact = false;
                detail::tuple_for_each(command.m_flags, [&](auto const &flg)
                    {
                        if (detail::contains(flg.short_names, name)) {
                            if (std::exchange(exact, true)) {
                                throw error_type(
                                    command.m_header + _(": ambiguous option: -") + name);
                            }
                        }
                    });
                if (!exact) {
                    throw error_type(command.m_header + _(": unrecognized option: -") + name);
                }
                detail::tuple_for_each(command.m_flags, [&](auto const &flg)
                    {
                        using flag_type = detail::remove_cvr_t<decltype(flg)>;
                        using value_type = typename flag_type::value_type;
                        constexpr auto option = flag_type::option();
                        if (detail::contains(flg.short_names, name)) {
                            string_type err;
                            detail::parse_flag_short<string_type, value_type>()(
                                it, match[1].second, arg_it, arg_last,
                                opts.template priv_value<option>(), flg, err);
                            if (!err.empty()) {
                                throw error_type(command.m_header + _(": ") + err);
                            }
                            if (flg.exclusive) exclusive = true;
                        }
                    });
            }
        } else if (subcommand_required && !subcommand_arg) {
            // subcommand and arguments
            subcommand_arg = detail::copy_shared(*arg_it);
            argument_args.insert(argument_args.end(), std::next(arg_it), arg_last);
            break;
        } else if (order == argument_order::flexible) {
            // argument
            argument_args.push_back(*arg_it);
        } else {
            // arguments
            argument_args.insert(argument_args.end(), arg_it, arg_last);
            break;
        }
    }

    if (exclusive) return opts;

    auto argument_it = argument_args.begin();
    auto const argument_last = argument_args.end();

    if (subcommand_required) {
        if (!subcommand_arg) {
            throw error_type(command.m_header + _(": command required"));
        }
        bool exact = false;
        detail::tuple_for_each(command.m_subcommands, [&](auto const &subcmd)
            {
                if (subcmd.name == *subcommand_arg) {
                    if (std::exchange(exact, true)) {
                        throw error_type(
                            command.m_header + _(": ambiguous command: ") + *subcommand_arg);
                    }
                }
            });
        if (!exact) {
            throw error_type(command.m_header + _(": unrecognized command: ") + *subcommand_arg);
        }
        detail::tuple_for_each(command.m_subcommands, [&](auto const &subcmd)
            {
                if (subcmd.name == *subcommand_arg) {
                    using subcommand_type = std::remove_cv_t<
                        std::remove_reference_t<decltype(subcmd)>>;
                    constexpr auto option = subcommand_type::option();
                    opts.template priv_value<option>() = detail::copy_shared(
                        parse(argument_it, argument_last, subcmd.command, order));
                }
            });
        return opts;
    }

    detail::tuple_for_each(command.m_arguments, [&](auto const &arg)
        {
            using argument_type = std::remove_cv_t<std::remove_reference_t<decltype(arg)>>;
            using value_type = typename argument_type::value_type;
            constexpr auto option = argument_type::option();
            string_type err;
            detail::parse_argument<string_type, value_type>()(
                argument_it, argument_last, opts.template priv_value<option>(), arg, err);
            if (!err.empty()) {
                throw error_type(command.m_header + _(": ") + err);
            }
        });

    if (argument_it != argument_last) {
        throw error_type(command.m_header + _(": unrecognized argument: ") + *argument_it);
    }

    return opts;
}